

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  int iVar6;
  
  pIVar4 = GImGui;
  ppIVar2 = (GImGui->WindowsFocusOrder).Data;
  iVar1 = (GImGui->WindowsFocusOrder).Size;
  if (ppIVar2[(long)iVar1 + -1] != window && 1 < (long)iVar1) {
    iVar6 = 1;
    uVar5 = iVar1 - 2;
    do {
      if (ppIVar2[uVar5] == window) {
        memmove(ppIVar2 + uVar5,ppIVar2 + (ulong)uVar5 + 1,(long)iVar6 << 3);
        (pIVar4->WindowsFocusOrder).Data[(long)(pIVar4->WindowsFocusOrder).Size + -1] = window;
        return;
      }
      iVar6 = iVar6 + 1;
      bVar3 = 0 < (int)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}